

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueCallbacks.cpp
# Opt level: O0

shared_ptr<BER_CONTAINER> __thiscall IntegerCallback::buildTypeWithValue(IntegerCallback *this)

{
  int iVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  long in_RSI;
  shared_ptr<BER_CONTAINER> sVar4;
  undefined1 local_28 [8];
  shared_ptr<IntegerType> val;
  IntegerCallback *this_local;
  
  if (*(long *)(in_RSI + 0x18) == 0) {
    std::shared_ptr<BER_CONTAINER>::shared_ptr((shared_ptr<BER_CONTAINER> *)this,(nullptr_t)0x0);
    _Var3._M_pi = extraout_RDX;
  }
  else {
    std::make_shared<IntegerType,int&>((int *)local_28);
    if (*(int *)(in_RSI + 0x20) != 0) {
      iVar1 = *(int *)(in_RSI + 0x20);
      peVar2 = Catch::clara::std::
               __shared_ptr_access<IntegerType,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<IntegerType,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_28);
      peVar2->_value = peVar2->_value / iVar1;
    }
    std::shared_ptr<BER_CONTAINER>::shared_ptr<IntegerType,void>
              ((shared_ptr<BER_CONTAINER> *)this,(shared_ptr<IntegerType> *)local_28);
    Catch::clara::std::shared_ptr<IntegerType>::~shared_ptr((shared_ptr<IntegerType> *)local_28);
    _Var3._M_pi = extraout_RDX_00;
  }
  sVar4.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  sVar4.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<BER_CONTAINER>)
         sVar4.super___shared_ptr<BER_CONTAINER,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<BER_CONTAINER> IntegerCallback::buildTypeWithValue(){
    ASSERT_VALID_VALUE(this->value);

    auto val = std::make_shared<IntegerType>(*this->value);
    if(this->modifier != 0){
        // Apple local division if callback was asked to
        val->_value /= this->modifier;
    }
    return val;
}